

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

bool TtfUtil::CalcAbsolutePoints(int *prgnX,int *prgnY,size_t cnPoints)

{
  int iVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  
  iVar1 = *prgnX;
  iVar2 = *prgnY;
  for (uVar3 = 1; uVar3 < cnPoints; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + prgnX[uVar3];
    prgnX[uVar3] = iVar1;
    iVar2 = iVar2 + prgnY[uVar3];
    prgnY[uVar3] = iVar2;
  }
  return true;
}

Assistant:

bool CalcAbsolutePoints(int * prgnX, int * prgnY, size_t cnPoints)
{
	int nX = prgnX[0];
	int nY = prgnY[0];
	for (size_t i = 1; i < cnPoints; ++i)
	{
		prgnX[i] += nX;
		nX = prgnX[i];
		prgnY[i] += nY;
		nY = prgnY[i];
	}

	return true;
}